

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLineNurbs::ArchiveIN(ChLineNurbs *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_30;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChLineNurbs>(marchive);
  ChLine::ArchiveIN(&this->super_ChLine,marchive);
  local_30._value = &this->points;
  local_30._name = "points";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->p;
  local_48._name = "p";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChLineNurbs::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLineNurbs>();
    // deserialize parent class
    ChLine::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(points);
    ////marchive >> CHNVP(weights); //**TODO MATRIX DESERIALIZATION
    ////marchive >> CHNVP(knots); //**TODO MATRIX DESERIALIZATION
    marchive >> CHNVP(p);
}